

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Vector3f __thiscall Quat4f::getAxisAngle(Quat4f *this,float *radiansOut)

{
  undefined1 auVar1 [16];
  float *in_RDX;
  double dVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  Vector3f VVar6;
  
  dVar2 = acos((double)*radiansOut);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(radiansOut[2] * radiansOut[2])),
                           ZEXT416((uint)radiansOut[1]),ZEXT416((uint)radiansOut[1]));
  fVar4 = radiansOut[3];
  *in_RDX = (float)(dVar2 + dVar2);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),auVar1);
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  fVar5 = 1.0 / auVar1._0_4_;
  uVar3 = (ulong)(uint)(fVar5 * radiansOut[1]);
  fVar4 = fVar5 * radiansOut[2];
  Vector3f::Vector3f((Vector3f *)this,fVar5 * radiansOut[1],fVar4,fVar5 * radiansOut[3]);
  VVar6.m_elements[2] = fVar4;
  VVar6.m_elements[0] = (float)(int)uVar3;
  VVar6.m_elements[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector3f)VVar6.m_elements;
}

Assistant:

Vector3f Quat4f::getAxisAngle( float* radiansOut )
{
	float theta = acos( w() ) * 2;
	float vectorNorm = sqrt( x() * x() + y() * y() + z() * z() );
	float reciprocalVectorNorm = 1.f / vectorNorm;

	*radiansOut = theta;
	return Vector3f
	(
		x() * reciprocalVectorNorm,
		y() * reciprocalVectorNorm,
		z() * reciprocalVectorNorm
	);
}